

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxSpecific.cpp
# Opt level: O0

int getEthernetRate(int sock,ifreq *item)

{
  int iVar1;
  undefined4 local_44 [2];
  ethtool_cmd eth_data;
  ifreq *item_local;
  int sock_local;
  
  eth_data.reserved = (__u32  [2])item;
  memset(local_44,0,0x2c);
  *(undefined4 **)((long)eth_data.reserved + 0x10) = local_44;
  local_44[0] = 1;
  iVar1 = ioctl(sock,0x8946,eth_data.reserved);
  if (iVar1 < 0) {
    item_local._4_4_ = 0;
  }
  else {
    item_local._4_4_ = (uint)(ushort)eth_data.supported;
  }
  return item_local._4_4_;
}

Assistant:

int getEthernetRate(int sock, struct ifreq * item)
{
    struct ethtool_cmd eth_data = {0};
    item->ifr_data=(char *)&eth_data;
    eth_data.cmd = ETHTOOL_GSET; /* get setting */
    if (ioctl(sock, SIOCETHTOOL, item) >= 0)
        return eth_data.speed;
    return 0;
}